

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

void __thiscall cmCTest::DetermineNextDayStop(cmCTest *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  time_t tVar4;
  undefined8 uVar5;
  time_t tVar6;
  time_t stop_time;
  char buf [1024];
  int tzone_offset;
  int local_hour;
  time_t gm_time;
  time_t tStack_20;
  int gm_hour;
  time_t current_time;
  tm *lctime;
  cmCTest *this_local;
  
  lctime = (tm *)this;
  tStack_20 = time((time_t *)0x0);
  current_time = (time_t)gmtime(&stack0xffffffffffffffe0);
  iVar1 = ((tm *)current_time)->tm_hour;
  tVar4 = mktime((tm *)current_time);
  current_time = (time_t)localtime(&stack0xffffffffffffffe0);
  buf._1020_4_ = ((tm *)current_time)->tm_hour;
  buf._1016_4_ = buf._1020_4_ - iVar1;
  if ((tStack_20 < tVar4) && (iVar1 < (int)buf._1020_4_)) {
    buf._1016_4_ = buf._1016_4_ + -0x18;
  }
  else if ((tVar4 < tStack_20) && ((int)buf._1020_4_ < iVar1)) {
    buf._1016_4_ = buf._1016_4_ + 0x18;
  }
  buf._1016_4_ = buf._1016_4_ * 100;
  iVar1 = ((tm *)current_time)->tm_year;
  iVar2 = ((tm *)current_time)->tm_mon;
  uVar3 = ((tm *)current_time)->tm_mday;
  uVar5 = std::__cxx11::string::c_str();
  sprintf((char *)&stop_time,"%d%02d%02d %s %+05i",(ulong)(iVar1 + 0x76c),(ulong)(iVar2 + 1),
          (ulong)uVar3,uVar5,buf._1016_4_);
  tVar6 = curl_getdate((char *)&stop_time,&stack0xffffffffffffffe0);
  if (tVar6 < tStack_20) {
    this->NextDayStopTime = true;
  }
  return;
}

Assistant:

void cmCTest::DetermineNextDayStop()
{
  struct tm* lctime;
  time_t current_time = time(CM_NULLPTR);
  lctime = gmtime(&current_time);
  int gm_hour = lctime->tm_hour;
  time_t gm_time = mktime(lctime);
  lctime = localtime(&current_time);
  int local_hour = lctime->tm_hour;

  int tzone_offset = local_hour - gm_hour;
  if (gm_time > current_time && gm_hour < local_hour) {
    // this means gm_time is on the next day
    tzone_offset -= 24;
  } else if (gm_time < current_time && gm_hour > local_hour) {
    // this means gm_time is on the previous day
    tzone_offset += 24;
  }

  tzone_offset *= 100;
  char buf[1024];
  sprintf(buf, "%d%02d%02d %s %+05i", lctime->tm_year + 1900,
          lctime->tm_mon + 1, lctime->tm_mday, this->StopTime.c_str(),
          tzone_offset);

  time_t stop_time = curl_getdate(buf, &current_time);

  if (stop_time < current_time) {
    this->NextDayStopTime = true;
  }
}